

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O2

void CB_ALGS::output_example(vw *all,cb *data,example *ec,label *ld)

{
  int iVar1;
  shared_data *this;
  int *piVar2;
  cb_class *pcVar3;
  _func_void_int_string_v_array<char> *p_Var4;
  v_array<char> vVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  ostream *poVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  float loss;
  undefined4 in_stack_fffffffffffffe18;
  vw *all_00;
  undefined1 in_stack_fffffffffffffe28 [16];
  stringstream outputStringStream;
  ostream local_1a8;
  
  cVar6 = (*(code *)PTR_test_label_002b2e50)(ld);
  loss = 0.0;
  if (cVar6 == '\0') {
    loss = get_unbiased_cost((data->cbcs).known_cost,&(data->cbcs).pred_scores,(ec->pred).multiclass
                            );
  }
  this = all->sd;
  bVar8 = ec->test_only;
  all_00 = all;
  bVar7 = (*(code *)PTR_test_label_002b2e50)(ld);
  shared_data::update(this,bVar8,(bool)(bVar7 ^ 1),loss,1.0,ec->num_features);
  piVar2 = (all->final_prediction_sink)._end;
  for (piVar11 = (all->final_prediction_sink)._begin; piVar11 != piVar2; piVar11 = piVar11 + 1) {
    (*all_00->print)(*piVar11,(float)(ec->pred).multiclass,0.0,ec->tag);
  }
  if (0 < all_00->raw_prediction) {
    std::__cxx11::stringstream::stringstream((stringstream *)&outputStringStream);
    uVar10 = 0;
    while( true ) {
      uVar12 = (ulong)uVar10;
      pcVar3 = (ld->costs)._begin;
      if ((ulong)((long)(ld->costs)._end - (long)pcVar3 >> 4) <= uVar12) break;
      loss = pcVar3[uVar12].partial_prediction;
      if (uVar12 != 0) {
        std::operator<<(&local_1a8,' ');
      }
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      poVar9 = std::operator<<(poVar9,':');
      std::ostream::operator<<(poVar9,loss);
      uVar10 = uVar10 + 1;
    }
    p_Var4 = all_00->print_text;
    iVar1 = all_00->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar5._begin._4_4_ = loss;
    vVar5._begin._0_4_ = in_stack_fffffffffffffe18;
    vVar5._end = (char *)all_00;
    vVar5.end_array = (char *)in_stack_fffffffffffffe28._0_8_;
    vVar5.erase_count = in_stack_fffffffffffffe28._8_8_;
    (*p_Var4)(iVar1,(string)ec->tag,vVar5);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
  }
  bVar8 = (bool)(*(code *)PTR_test_label_002b2e50)(ld);
  CB::print_update(all_00,bVar8,ec,(multi_ex *)0x0,false);
  return;
}

Assistant:

void output_example(vw& all, cb& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;
  if (!CB::cb_label.test_label(&ld))
    loss = get_unbiased_cost(c.known_cost, c.pred_scores, ec.pred.multiclass);

  all.sd->update(ec.test_only, !CB::cb_label.test_label(&ld), loss, 1.f, ec.num_features);

  for (int sink : all.final_prediction_sink) all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      cb_class cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.action << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, CB::cb_label.test_label(&ld), ec, nullptr, false);
}